

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O3

void __thiscall boost::unit_test::decorator::precondition::~precondition(precondition *this)

{
  (this->super_base)._vptr_base = (_func_int **)&PTR_apply_001c8a80;
  function1<boost::test_tools::assertion_result,_unsigned_long>::~function1
            (&(this->m_precondition).
              super_function1<boost::test_tools::assertion_result,_unsigned_long>);
  operator_delete(this,0x28);
  return;
}

Assistant:

class BOOST_TEST_DECL precondition : public decorator::base {
public:
    typedef boost::function<test_tools::assertion_result (test_unit_id)>   predicate_t;

    explicit                precondition( predicate_t p ) : m_precondition( p ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new precondition( m_precondition )); }

    // Data members
    predicate_t             m_precondition;
}